

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::CentroidQualifierAtSampleCase::
genVertexSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  ostringstream buf;
  ContextType local_1b4;
  string local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_barycentricsA;\nin highp vec4 a_barycentricsB;\nout highp vec3 v_barycentricsA;\ncentroid out highp vec3 v_barycentricsB;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_barycentricsA = a_barycentricsA.xyz;\n\tv_barycentricsB = a_barycentricsB.xyz;\n}\n"
             ,0x136);
  std::__cxx11::stringbuf::str();
  local_1b4.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1b0,&local_1b4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string CentroidQualifierAtSampleCase::genVertexSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"in highp vec4 a_position;\n"
			"in highp vec4 a_barycentricsA;\n"
			"in highp vec4 a_barycentricsB;\n"
			"out highp vec3 v_barycentricsA;\n"
			"centroid out highp vec3 v_barycentricsB;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"	v_barycentricsA = a_barycentricsA.xyz;\n"
			"	v_barycentricsB = a_barycentricsB.xyz;\n"
			"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}